

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.cpp
# Opt level: O1

void __thiscall cppcms::form::iterator::next(iterator *this)

{
  form *pfVar1;
  pointer ppVar2;
  int iVar3;
  long lVar4;
  _Elt_pointer puVar5;
  undefined4 extraout_var;
  undefined8 in_R8;
  undefined8 in_R9;
  uint uVar6;
  form *pfVar7;
  
  pfVar1 = this->current_;
  pfVar7 = pfVar1;
  do {
    if (pfVar1 == (form *)0x0) {
      return;
    }
    uVar6 = this->offset_;
    ppVar2 = (pfVar1->elements_).
             super__Vector_base<std::pair<cppcms::base_form_*,_bool>,_std::allocator<std::pair<cppcms::base_form_*,_bool>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)uVar6 <
        (ulong)((long)(pfVar1->elements_).
                      super__Vector_base<std::pair<cppcms::base_form_*,_bool>,_std::allocator<std::pair<cppcms::base_form_*,_bool>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar2 >> 4)) {
      pfVar1 = (form *)ppVar2[uVar6].first;
      if ((pfVar1 != (form *)0x0) &&
         (lVar4 = __dynamic_cast(pfVar1,&base_form::typeinfo,&widgets::base_widget::typeinfo,0,in_R8
                                 ,in_R9,pfVar7), lVar4 != 0)) {
        uVar6 = uVar6 + 1;
LAB_001f5afb:
        this->offset_ = uVar6;
        return;
      }
      this->current_ = pfVar1;
      pfVar7 = (form *)CONCAT44(uVar6 + 1,(int)pfVar7);
      puVar5 = (this->return_positions_).c.
               super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Deque_impl_data._M_finish._M_cur;
      if (puVar5 == (this->return_positions_).c.
                    super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Deque_impl_data._M_finish._M_last + -1) {
        std::deque<unsigned_int,_std::allocator<unsigned_int>_>::_M_push_back_aux<unsigned_int>
                  ((deque<unsigned_int,_std::allocator<unsigned_int>_> *)this,
                   (uint *)&stack0xffffffffffffffcc);
      }
      else {
        *puVar5 = uVar6 + 1;
        (this->return_positions_).c.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>.
        _M_impl.super__Deque_impl_data._M_finish._M_cur = puVar5 + 1;
      }
      this->offset_ = 0;
    }
    else {
      puVar5 = (this->return_positions_).c.
               super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Deque_impl_data._M_finish._M_cur;
      if (puVar5 == (this->return_positions_).c.
                    super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Deque_impl_data._M_start._M_cur) {
        this->current_ = (form *)0x0;
        uVar6 = 0;
        goto LAB_001f5afb;
      }
      if (puVar5 == (this->return_positions_).c.
                    super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Deque_impl_data._M_finish._M_first) {
        puVar5 = (this->return_positions_).c.
                 super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Deque_impl_data._M_finish._M_node[-1] + 0x80;
      }
      this->offset_ = puVar5[-1];
      std::deque<unsigned_int,_std::allocator<unsigned_int>_>::pop_back
                ((deque<unsigned_int,_std::allocator<unsigned_int>_> *)this);
      iVar3 = (*(this->current_->super_base_form)._vptr_base_form[5])();
      this->current_ = (form *)CONCAT44(extraout_var,iVar3);
    }
    pfVar1 = this->current_;
  } while( true );
}

Assistant:

void form::iterator::next()
{
	for(;;) {
		if(!current_)
			return;
		if(offset_ >=current_->elements_.size()) {
			if(return_positions_.empty()) {
				zero();
				return;
			}
			offset_ = return_positions_.top();
			return_positions_.pop();
			current_ = current_->parent();
		}
		else if(dynamic_cast<widgets::base_widget *>(current_->elements_[offset_].first)!=0) {
			offset_++;
			return;
		}
		else {
			// Elements can be only base_widget or form... so it should be safe
			current_ = static_cast<form *>(current_->elements_[offset_].first);
			return_positions_.push(offset_+1);
			offset_=0;
		}
	}
}